

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::SnapshotEventLogEntry_UnloadEventMemory
               (EventLogEntry *evt,UnlinkableSlabAllocator *alloc)

{
  SnapshotEventLogEntry *pSVar1;
  
  pSVar1 = GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                     (evt);
  if (pSVar1->LiveContextCount != 0) {
    SlabAllocatorBase<8>::UnlinkAllocation(alloc,pSVar1->LiveContextIdArray);
  }
  if (pSVar1->LongLivedRefRootsCount != 0) {
    SlabAllocatorBase<8>::UnlinkAllocation(alloc,pSVar1->LongLivedRefRootsIdArray);
  }
  SnapshotEventLogEntry_UnloadSnapshot(evt);
  return;
}

Assistant:

void SnapshotEventLogEntry_UnloadEventMemory(EventLogEntry* evt, UnlinkableSlabAllocator& alloc)
        {
            SnapshotEventLogEntry* snapEvt = GetInlineEventDataAs<SnapshotEventLogEntry, EventKind::SnapshotTag>(evt);

            if(snapEvt->LiveContextCount != 0)
            {
                alloc.UnlinkAllocation(snapEvt->LiveContextIdArray);
            }

            if(snapEvt->LongLivedRefRootsCount != 0)
            {
                alloc.UnlinkAllocation(snapEvt->LongLivedRefRootsIdArray);
            }

            SnapshotEventLogEntry_UnloadSnapshot(evt);
        }